

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  mtree *mtree;
  __mode_t p;
  int iVar2;
  int iVar3;
  mode_t mVar4;
  mtree_entry *pmVar5;
  int *piVar6;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar7;
  archive_string *paVar8;
  size_t sVar9;
  mtree_entry **ppmVar10;
  ulong uVar11;
  archive_rb_node *paVar12;
  archive_rb_node *paVar13;
  size_t len;
  mtree_entry *pmVar14;
  la_int64_t lVar15;
  char *pcVar16;
  byte *pbVar17;
  char *pcVar18;
  size_t sVar19;
  __dev_t _Var20;
  ulong uVar21;
  ulong uVar22;
  mtree_option *pmVar23;
  char *pcVar24;
  mtree_entry *pmVar25;
  long lVar26;
  uint uVar27;
  mtree_entry *pmVar28;
  ulong local_118;
  uint local_10c;
  mtree_option *global;
  mtree_entry *local_100;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  int local_e4;
  archive_rb_tree *local_e0;
  long local_d8;
  archive_entry *sparse_entry;
  mtree_entry **local_c8;
  stat st_storage;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      return -0x1e;
    }
    local_c8 = &mtree->entries;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    global = (mtree_option *)0x0;
    detect_form(a,(int *)&sparse_entry);
    local_e0 = &mtree->rbtree;
    local_f8 = (mtree_entry *)0x0;
    local_d8 = 1;
LAB_00369c9b:
    lVar26 = 0;
    local_118 = 0;
    while (__s = __archive_read_ahead(a,1,(ssize_t *)&st_storage), _Var20 = st_storage.st_dev,
          __s != (void *)0x0) {
      if ((long)st_storage.st_dev < 0) {
LAB_0036a3d0:
        uVar21 = 0xffffffffffffffe2;
        goto LAB_0036a3d3;
      }
      pvVar7 = memchr(__s,10,st_storage.st_dev);
      if (pvVar7 != (void *)0x0) {
        _Var20 = (long)pvVar7 + (1 - (long)__s);
        st_storage.st_dev = _Var20;
      }
      if (0xffff < (long)(_Var20 + local_118)) {
        pcVar16 = "Line too long";
        iVar2 = 0x54;
LAB_0036a3c3:
        archive_set_error(&a->archive,iVar2,pcVar16);
        goto LAB_0036a3d0;
      }
      paVar8 = archive_string_ensure((archive_string *)mtree,_Var20 + local_118 + 1);
      if (paVar8 == (archive_string *)0x0) {
        pcVar16 = "Can\'t allocate working buffer";
        iVar2 = 0xc;
        goto LAB_0036a3c3;
      }
      memcpy((mtree->line).s + local_118,__s,st_storage.st_dev);
      __archive_read_consume(a,st_storage.st_dev);
      _Var20 = st_storage.st_dev;
      uVar21 = local_118 + st_storage.st_dev;
      (mtree->line).s[uVar21] = '\0';
      pmVar25 = (mtree_entry *)(mtree->line).s;
      pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
LAB_00369d66:
      cVar1 = *pcVar16;
      if (cVar1 == '#') {
        if (pvVar7 == (void *)0x0) goto LAB_00369da9;
LAB_00369d97:
        pcVar16 = pcVar16 + 1;
        goto LAB_00369d66;
      }
      if (cVar1 != '\\') {
        if (cVar1 == '\0') goto LAB_00369da9;
        if (cVar1 == '\n') {
          if (uVar21 == 0) break;
          if ((long)uVar21 < 0) goto LAB_0036a3d3;
          lVar26 = 0;
          pmVar5 = pmVar25;
          goto LAB_00369dcd;
        }
        goto LAB_00369d97;
      }
      if (pcVar16[1] == '\0') goto LAB_00369d97;
      if (pcVar16[1] != '\n') {
        pcVar16 = pcVar16 + 1;
        goto LAB_00369d97;
      }
      *(char *)((long)(pmVar25->rbnode).rb_nodes + (uVar21 - 2)) = '\0';
      uVar21 = uVar21 - 2;
      pmVar25 = (mtree_entry *)(mtree->line).s;
LAB_00369da9:
      lVar26 = (long)pcVar16 - (long)pmVar25;
      local_118 = uVar21;
    }
    mtree->this_entry = mtree->entries;
    uVar21 = 0;
    goto LAB_0036a3d3;
  }
LAB_0036988d:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  paVar8 = &mtree->current_dir;
  pmVar25 = (mtree_entry *)&mtree->rbtree;
  pmVar5 = mtree->this_entry;
  local_100 = pmVar25;
  do {
    if (pmVar5 == (mtree_entry *)0x0) {
      return 1;
    }
    pcVar16 = pmVar5->name;
    if (((*pcVar16 == '.') && (pcVar16[1] == '.')) && (pcVar16[2] == '\0')) {
      pmVar5->used = '\x01';
      sVar19 = (mtree->current_dir).length;
      if (sVar19 != 0) {
        pcVar16 = paVar8->s;
        pcVar18 = pcVar16 + sVar19;
        do {
          pcVar24 = pcVar18;
          pcVar18 = pcVar24 + -1;
          if (pcVar18 < pcVar16) break;
        } while (*pcVar18 != '/');
        pcVar24 = pcVar24 + -2;
        if (pcVar18 < pcVar16) {
          pcVar24 = pcVar18;
        }
        (mtree->current_dir).length = (size_t)(pcVar24 + (1 - (long)pcVar16));
      }
    }
    else if (pmVar5->used == '\0') {
      pmVar5->used = '\x01';
      global = (mtree_option *)entry;
      archive_entry_set_filetype(entry,0x8000);
      archive_entry_set_size(entry,0);
      (mtree->contents_name).length = 0;
      local_10c = 0;
      iVar2 = parse_line(a,entry,mtree,pmVar5,(int *)&local_10c);
      if (pmVar5->full == '\0') {
        sVar19 = (mtree->current_dir).length;
        if (sVar19 != 0) {
          archive_strcat(paVar8,"/");
        }
        archive_strcat(paVar8,pmVar5->name);
        archive_entry_copy_pathname(entry,paVar8->s);
        mVar4 = archive_entry_filetype(entry);
        pmVar25 = local_100;
        if (mVar4 != 0x4000) {
          (mtree->current_dir).length = sVar19;
        }
      }
      else {
        archive_entry_copy_pathname(entry,pmVar5->name);
        for (pmVar5 = (mtree_entry *)
                      __archive_rb_tree_find_node((archive_rb_tree *)pmVar25,pmVar5->name);
            pmVar5 != (mtree_entry *)0x0; pmVar5 = pmVar5->next_dup) {
          if ((pmVar5->full != '\0') && (pmVar5->used == '\0')) {
            pmVar5->used = '\x01';
            iVar3 = parse_line(a,entry,mtree,pmVar5,(int *)&local_10c);
            if (iVar3 < iVar2) {
              iVar2 = iVar3;
            }
          }
        }
      }
      if (mtree->checkfs == '\0') goto LAB_0036a360;
      mtree->fd = -1;
      if ((mtree->contents_name).length == 0) {
        pcVar16 = archive_entry_pathname(entry);
      }
      else {
        pcVar16 = (mtree->contents_name).s;
      }
      mVar4 = archive_entry_filetype(entry);
      if ((mVar4 == 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 == 0x4000)) {
        iVar3 = open(pcVar16,0x80000);
        mtree->fd = iVar3;
        __archive_ensure_cloexec_flag(iVar3);
        iVar3 = mtree->fd;
        if (iVar3 == -1) {
          piVar6 = __errno_location();
          if ((*piVar6 != 2) || ((mtree->contents_name).length != 0)) {
            archive_set_error(&a->archive,*piVar6,"Can\'t open %s",pcVar16);
            iVar2 = -0x14;
          }
          goto LAB_00369a6f;
        }
      }
      else {
LAB_00369a6f:
        iVar3 = mtree->fd;
      }
      if (iVar3 < 0) {
        iVar3 = lstat(pcVar16,(stat *)&st_storage);
        if (iVar3 == -1) goto LAB_00369aff;
LAB_00369ac4:
        p = st_storage.st_mode;
        uVar27 = st_storage.st_mode & 0xf000;
        if (uVar27 == 0xa000) {
          mVar4 = archive_entry_filetype(entry);
          if (mVar4 != 0xa000) goto LAB_00369b6d;
        }
        else if ((uVar27 != 0x8000) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) {
LAB_00369b6d:
          if (((~p & 0xc000) != 0) || (mVar4 = archive_entry_filetype(entry), mVar4 != 0xc000)) {
            switch(uVar27 - 0x1000 >> 0xc) {
            case 0:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x1000) goto LAB_0036a22f;
              break;
            case 1:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x2000) goto LAB_0036a22f;
              break;
            case 3:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x4000) goto LAB_0036a22f;
              break;
            case 5:
              mVar4 = archive_entry_filetype(entry);
              if (mVar4 == 0x6000) goto LAB_0036a22f;
            }
            if (-1 < mtree->fd) {
              close(mtree->fd);
            }
            mtree->fd = -1;
            if ((local_10c & 0x800) == 0) {
              if (iVar2 != 0) {
                return iVar2;
              }
              pcVar16 = archive_entry_pathname(entry);
              archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                pcVar16);
              return -0x14;
            }
            goto LAB_00369c1a;
          }
        }
LAB_0036a22f:
        uVar27 = local_10c;
        if (((local_10c & 0x1001) != 1) &&
           ((mVar4 = archive_entry_filetype(entry), mVar4 == 0x2000 ||
            (mVar4 = archive_entry_filetype(entry), mVar4 == 0x6000)))) {
          archive_entry_set_rdev(entry,st_storage.st_rdev);
        }
        if ((uVar27 & 0xc) == 0 || (uVar27 >> 0xc & 1) != 0) {
          archive_entry_set_gid(entry,(ulong)st_storage.st_gid);
        }
        if ((uVar27 & 0x600) == 0 || (uVar27 >> 0xc & 1) != 0) {
          archive_entry_set_uid(entry,(ulong)st_storage.st_uid);
        }
        if ((uVar27 & 0x1010) != 0x10) {
          archive_entry_set_mtime(entry,st_storage.st_mtim.tv_sec,st_storage.st_mtim.tv_nsec);
        }
        if ((uVar27 & 0x1020) != 0x20) {
          archive_entry_set_nlink(entry,(uint)st_storage.st_nlink);
        }
        if ((uVar27 & 0x1040) != 0x40) {
          archive_entry_set_perm(entry,p);
        }
        if ((uVar27 & 0x1080) != 0x80) {
          archive_entry_set_size(entry,st_storage.st_size);
        }
        archive_entry_set_ino(entry,st_storage.st_ino);
        archive_entry_set_dev(entry,st_storage.st_dev);
        archive_entry_linkify(mtree->resolver,(archive_entry **)&global,&sparse_entry);
        entry = (archive_entry *)global;
LAB_0036a360:
        lVar15 = archive_entry_size(entry);
        mtree->cur_size = lVar15;
        mtree->offset = 0;
        return iVar2;
      }
      iVar3 = fstat(iVar3,(stat *)&st_storage);
      if (iVar3 != -1) goto LAB_00369ac4;
      piVar6 = __errno_location();
      archive_set_error(&a->archive,*piVar6,"Could not fstat %s",pcVar16);
      close(mtree->fd);
      mtree->fd = -1;
      iVar2 = -0x14;
LAB_00369aff:
      if ((local_10c & 0x800) == 0) goto LAB_0036a360;
LAB_00369c1a:
      pmVar5 = mtree->this_entry;
    }
    pmVar5 = pmVar5->next;
    mtree->this_entry = pmVar5;
  } while( true );
LAB_00369dcd:
  pmVar5 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + 1);
  uVar21 = (ulong)*(byte *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
  if (0x2f < uVar21) goto LAB_00369f16;
  if ((0x100000200U >> (uVar21 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar21 & 0x3f) & 1) != 0) goto LAB_00369dfa;
    if (uVar21 == 0x2f) {
      uVar21 = (st_storage.st_dev + local_118) - lVar26;
      if (4 < (long)uVar21) {
        pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
        iVar2 = strncmp(pcVar16,"/set",4);
        if (iVar2 == 0) {
          cVar1 = *(char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 4);
          if ((cVar1 == ' ') || (cVar1 == '\t')) {
            pcVar16 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 4);
            goto LAB_0036a02b;
          }
        }
        else if (((6 < uVar21) && (iVar2 = strncmp(pcVar16,"/unset",6), iVar2 == 0)) &&
                ((cVar1 = *(char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 6), cVar1 == ' ' ||
                 (cVar1 == '\t')))) {
          pcVar18 = (char *)((long)(pmVar25->rbnode).rb_nodes + lVar26 + 6);
          pcVar16 = strchr(pcVar18,0x3d);
          if (pcVar16 == (char *)0x0) goto LAB_00369ef6;
          pcVar16 = "/unset shall not contain `=\'";
          iVar2 = -1;
          goto LAB_0036a446;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_d8);
      goto LAB_0036a450;
    }
    goto LAB_00369f16;
  }
  lVar26 = lVar26 + 1;
  goto LAB_00369dcd;
LAB_0036a02b:
  sVar9 = strspn(pcVar16," \t\r\n");
  if (pcVar16[sVar9] == '\0') goto LAB_00369dfa;
  pcVar24 = pcVar16 + sVar9;
  sVar9 = strcspn(pcVar24," \t\r\n");
  pcVar16 = pcVar24 + sVar9;
  pcVar18 = strchr(pcVar24,0x3d);
  sVar19 = (long)pcVar18 - (long)pcVar24;
  if (pcVar16 < pcVar18) {
    sVar19 = sVar9;
  }
  remove_option(&global,pcVar24,sVar19);
  uVar27 = add_option(a,&global,pcVar24,sVar9);
  if (uVar27 != 0) goto LAB_0036a408;
  goto LAB_0036a02b;
LAB_00369ef6:
  while( true ) {
    sVar9 = strspn(pcVar18," \t\r\n");
    cVar1 = pcVar18[sVar9];
    if (cVar1 == '\0') break;
    pcVar18 = pcVar18 + sVar9;
    sVar9 = strcspn(pcVar18," \t\r\n");
    if (((cVar1 == 'a' && sVar9 == 3) && (pcVar18[1] == 'l')) && (pcVar18[2] == 'l')) {
      free_options(global);
      global = (mtree_option *)0x0;
    }
    else {
      remove_option(&global,pcVar18,sVar9);
    }
    pcVar18 = pcVar18 + sVar9;
  }
LAB_00369dfa:
  local_d8 = local_d8 + 1;
  goto LAB_00369c9b;
LAB_00369f16:
  local_e4 = (int)sparse_entry;
  local_100 = (mtree_entry *)malloc(0x40);
  if (local_100 != (mtree_entry *)0x0) {
    pmVar28 = (mtree_entry *)((long)(pmVar25->rbnode).rb_nodes + lVar26);
    uVar21 = (_Var20 + local_118) - lVar26;
    *(undefined8 *)((long)&local_100->options + 2) = 0;
    *(undefined8 *)((long)&local_100->name + 2) = 0;
    local_100->next = (mtree_entry *)0x0;
    local_100->options = (mtree_option *)0x0;
    ppmVar10 = &local_f8->next;
    if (local_f8 == (mtree_entry *)0x0) {
      ppmVar10 = local_c8;
    }
    *ppmVar10 = local_100;
    local_f0 = local_100;
    if (local_e4 == 0) {
      pcVar16 = (char *)strcspn((char *)pmVar28," \t\r\n");
      pmVar25 = (mtree_entry *)(pcVar16 + (long)((long)(pmVar25->rbnode).rb_nodes + lVar26));
      local_f8 = (mtree_entry *)(uVar21 + (long)pmVar25);
    }
    else {
      uVar11 = (long)uVar21 >> 0x3f & uVar21;
      pbVar17 = (byte *)((long)(pmVar25->rbnode).rb_nodes + _Var20 + local_118);
      while (((pbVar17 = pbVar17 + -1, uVar22 = uVar11, 0 < (long)uVar21 &&
              (uVar22 = uVar21, (ulong)*pbVar17 < 0x21)) &&
             ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
        uVar21 = uVar21 - 1;
      }
      uVar21 = 0;
      local_f8 = pmVar28;
      if (0 < (long)uVar22) {
        uVar21 = uVar22;
      }
      while (uVar21 != 0) {
        if (((ulong)(byte)pmVar5[-1].field_0x3f < 0x21) &&
           ((0x100002600U >> ((ulong)(byte)pmVar5[-1].field_0x3f & 0x3f) & 1) != 0)) {
          local_f8 = pmVar5;
        }
        pmVar5 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + 1);
        uVar21 = uVar21 - 1;
      }
      pcVar16 = (char *)((long)pmVar25 + lVar26 + (uVar22 - (long)local_f8));
      pmVar25 = pmVar28;
      pmVar28 = local_f8;
    }
    pcVar18 = (char *)malloc((size_t)(pcVar16 + 1));
    pmVar5 = local_f0;
    local_f0->name = pcVar18;
    if (pcVar18 != (char *)0x0) {
      memcpy(pcVar18,pmVar28,(size_t)pcVar16);
      pcVar18[(long)pcVar16] = '\0';
      parse_escapes(pcVar18,pmVar5);
      pmVar28 = local_100;
      pmVar5->next_dup = (mtree_entry *)0x0;
      if ((pmVar5->full != '\0') &&
         (iVar2 = __archive_rb_tree_insert_node(local_e0,&pmVar5->rbnode), iVar2 == 0)) {
        paVar12 = __archive_rb_tree_find_node(local_e0,pmVar5->name);
        do {
          paVar13 = paVar12;
          paVar12 = paVar13[1].rb_nodes[0];
        } while (paVar12 != (archive_rb_node *)0x0);
        paVar13[1].rb_nodes[0] = &pmVar5->rbnode;
      }
      pmVar23 = (mtree_option *)&global;
      while (pmVar23 = pmVar23->next, pmVar5 = (mtree_entry *)&pmVar28->options,
            pmVar23 != (mtree_option *)0x0) {
        pcVar16 = pmVar23->value;
        sVar9 = strlen(pcVar16);
        iVar2 = add_option(a,&pmVar28->options,pcVar16,sVar9);
        if (iVar2 != 0) goto LAB_0036a3d8;
      }
      while ((local_100 = pmVar5, sVar9 = strspn((char *)pmVar25," \t\r\n"),
             *(char *)((long)(pmVar25->rbnode).rb_nodes + sVar9) != '\0' &&
             (pmVar5 = (mtree_entry *)((long)(pmVar25->rbnode).rb_nodes + sVar9), pmVar5 < local_f8)
             )) {
        len = strcspn((char *)pmVar5," \t\r\n");
        pmVar25 = (mtree_entry *)((long)(pmVar5->rbnode).rb_nodes + len);
        pmVar14 = (mtree_entry *)strchr((char *)pmVar5,0x3d);
        pmVar28 = local_100;
        sVar9 = (long)pmVar14 - (long)pmVar5;
        if (pmVar25 < pmVar14) {
          sVar9 = len;
        }
        if (pmVar14 == (mtree_entry *)0x0) {
          sVar9 = len;
        }
        remove_option((mtree_option **)local_100,(char *)pmVar5,sVar9);
        uVar27 = add_option(a,(mtree_option **)pmVar28,(char *)pmVar5,len);
        pmVar5 = local_100;
        if (uVar27 != 0) goto LAB_0036a408;
      }
      local_f8 = local_f0;
      goto LAB_00369dfa;
    }
  }
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  pcVar16 = "Can\'t allocate memory";
LAB_0036a446:
  archive_set_error(&a->archive,iVar2,pcVar16);
LAB_0036a450:
  iVar2 = -0x1e;
  goto LAB_0036a3d8;
LAB_0036a408:
  uVar21 = (ulong)uVar27;
LAB_0036a3d3:
  iVar2 = (int)uVar21;
LAB_0036a3d8:
  free_options(global);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_0036988d;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}